

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

polylabel *
Search::allowed_actions_to_ld
          (search_private *priv,size_t ec_cnt,action *allowed_actions,size_t allowed_actions_cnt,
          float *allowed_actions_cost)

{
  bool isCB;
  polylabel *ld;
  uint uVar1;
  ulong uVar2;
  action k;
  ulong uVar3;
  uint32_t uVar4;
  size_t i;
  size_t sVar5;
  
  ld = priv->allowed_actions_cache;
  isCB = priv->cb_learner;
  uVar3 = (long)(ld->cs).costs._end - (long)(ld->cs).costs._begin >> 4;
  if (priv->is_ldf == true) {
    if (ec_cnt < (uVar3 & 0xffffffff)) {
      cs_costs_resize(isCB,ld,ec_cnt);
    }
    else if ((uVar3 & 0xffffffff) < ec_cnt) {
      for (; (uVar3 & 0xffffffff) < ec_cnt; uVar3 = (ulong)((uint32_t)uVar3 + 1)) {
        cs_cost_push_back(isCB,ld,(uint32_t)uVar3,3.4028235e+38);
      }
    }
  }
  else if (priv->use_action_costs == true) {
    if (allowed_actions == (action *)0x0) {
      if (uVar3 != priv->A) {
        cs_costs_erase(isCB,ld);
        for (uVar4 = 1; uVar3 = priv->A, uVar4 - 1 < uVar3; uVar4 = uVar4 + 1) {
          cs_cost_push_back(isCB,ld,uVar4,0.0);
        }
      }
      for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < uVar3; uVar1 = uVar1 + 1) {
        (ld->cs).costs._begin[uVar2].x = allowed_actions_cost[uVar2];
        uVar3 = priv->A;
      }
    }
    else {
      cs_costs_erase(isCB,ld);
      for (uVar1 = 0; uVar3 = (ulong)uVar1, uVar3 < allowed_actions_cnt; uVar1 = uVar1 + 1) {
        cs_cost_push_back(isCB,ld,allowed_actions[uVar3],allowed_actions_cost[uVar3]);
      }
    }
  }
  else if (allowed_actions == (action *)0x0 || allowed_actions_cnt == 0) {
    if ((uVar3 & 0xffffffff) != priv->A) {
      cs_costs_erase(isCB,ld);
      for (uVar4 = 1; (ulong)(uVar4 - 1) < priv->A; uVar4 = uVar4 + 1) {
        cs_cost_push_back(isCB,ld,uVar4,3.4028235e+38);
      }
    }
  }
  else {
    cs_costs_erase(isCB,ld);
    for (sVar5 = 0; allowed_actions_cnt != sVar5; sVar5 = sVar5 + 1) {
      cs_cost_push_back(isCB,ld,allowed_actions[sVar5],3.4028235e+38);
    }
  }
  return ld;
}

Assistant:

polylabel& allowed_actions_to_ld(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost)
{
  bool isCB = priv.cb_learner;
  polylabel& ld = *priv.allowed_actions_cache;
  uint32_t num_costs = (uint32_t)cs_get_costs_size(isCB, ld);

  if (priv.is_ldf)  // LDF version easier
  {
    if (num_costs > ec_cnt)
      cs_costs_resize(isCB, ld, ec_cnt);
    else if (num_costs < ec_cnt)
      for (action k = num_costs; k < ec_cnt; k++) cs_cost_push_back(isCB, ld, k, FLT_MAX);
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, ld) != priv.A)
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, ld, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, ld);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, ld, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF version, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      if (num_costs != priv.A)  // if there are already A-many actions, they must be the right ones, unless the user did
                                // something stupid like putting duplicate allowed_actions...
      {
        cs_costs_erase(isCB, ld);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, ld, k + 1, FLT_MAX);  //+1 because MC is 1-based
      }
    }
    else  // we need to peek at allowed_actions
    {
      cs_costs_erase(isCB, ld);
      for (size_t i = 0; i < allowed_actions_cnt; i++) cs_cost_push_back(isCB, ld, allowed_actions[i], FLT_MAX);
    }
  }

  return ld;
}